

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LICMPass::HoistInstruction(LICMPass *this,Loop *loop,Instruction *inst)

{
  Function *pFVar1;
  Function *in_RAX;
  BasicBlock *block;
  Function *local_28;
  
  local_28 = in_RAX;
  block = Loop::GetOrCreatePreHeaderBlock(loop);
  if (block != (BasicBlock *)0x0) {
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffd8);
    pFVar1 = (Function *)
             (local_28->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((pFVar1 != (Function *)0x0) &&
        (*(bool *)&(pFVar1->params_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == false)) &&
       (((ulong)(pFVar1->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                _vptr_IntrusiveNodeBase & 0xfffffffe) == 0xf6)) {
      local_28 = pFVar1;
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>,(Instruction *)local_28);
    IRContext::set_instr_block((this->super_Pass).context_,inst,block);
  }
  return block != (BasicBlock *)0x0;
}

Assistant:

bool LICMPass::HoistInstruction(Loop* loop, Instruction* inst) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header_bb = loop->GetOrCreatePreHeaderBlock();
  if (!pre_header_bb) {
    return false;
  }
  Instruction* insertion_point = &*pre_header_bb->tail();
  Instruction* previous_node = insertion_point->PreviousNode();
  if (previous_node && (previous_node->opcode() == spv::Op::OpLoopMerge ||
                        previous_node->opcode() == spv::Op::OpSelectionMerge)) {
    insertion_point = previous_node;
  }

  inst->InsertBefore(insertion_point);
  context()->set_instr_block(inst, pre_header_bb);
  return true;
}